

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O0

void av1_generate_block_2x2_hash_value
               (IntraBCHashInfo *intrabc_hash_info,YV12_BUFFER_CONFIG *picture,
               uint32_t **pic_block_hash,int8_t **pic_block_same_info)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  int x_pos_1;
  int y_pos_1;
  int pos_1;
  uint8_t p_1 [4];
  int x_pos;
  int y_pos;
  int pos;
  uint16_t p [4];
  int length;
  CRC_CALCULATOR *calc_2;
  CRC_CALCULATOR *calc_1;
  int y_end;
  int x_end;
  int height;
  int width;
  undefined4 in_stack_ffffffffffffff98;
  int iVar4;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar5;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_58;
  int local_54;
  int local_50;
  uint16_t local_4c [4];
  undefined4 local_44;
  long local_40;
  long local_38;
  int local_30;
  int local_2c;
  undefined4 local_28;
  undefined4 local_24;
  long *local_20;
  long *local_18;
  long local_10;
  
  local_24 = 2;
  local_28 = 2;
  local_2c = *(int *)(in_RSI + 0x10) + -1;
  local_30 = *(int *)(in_RSI + 0x18) + -1;
  local_38 = in_RDI + 0x28;
  local_40 = in_RDI + 0x438;
  local_44 = 4;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((*(uint *)(in_RSI + 0xc0) & 8) == 0) {
    iVar1 = 0;
    for (iVar5 = 0; iVar5 < local_30; iVar5 = iVar5 + 1) {
      for (iVar4 = 0; iVar4 < local_2c; iVar4 = iVar4 + 1) {
        get_pixels_in_1D_char_array_by_block_2x2
                  ((uint8_t *)
                   (*(long *)(local_10 + 0x28) + (long)(iVar5 * *(int *)(local_10 + 0x20)) +
                   (long)iVar4),*(int *)(local_10 + 0x20),&stack0xffffffffffffffa4);
        iVar3 = is_block_2x2_row_same_value(&stack0xffffffffffffffa4);
        *(char *)(*local_20 + (long)iVar1) = (char)iVar3;
        iVar3 = is_block_2x2_col_same_value(&stack0xffffffffffffffa4);
        *(char *)(local_20[1] + (long)iVar1) = (char)iVar3;
        uVar2 = av1_get_crc_value((CRC_CALCULATOR *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),
                                  (uint8_t *)CONCAT44(iVar5,iVar4),0);
        *(uint32_t *)(*local_18 + (long)iVar1 * 4) = uVar2;
        uVar2 = av1_get_crc_value((CRC_CALCULATOR *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),
                                  (uint8_t *)CONCAT44(iVar5,iVar4),0);
        *(uint32_t *)(local_18[1] + (long)iVar1 * 4) = uVar2;
        iVar1 = iVar1 + 1;
      }
      iVar1 = iVar1 + 1;
    }
  }
  else {
    local_50 = 0;
    for (local_54 = 0; local_54 < local_30; local_54 = local_54 + 1) {
      for (local_58 = 0; local_58 < local_2c; local_58 = local_58 + 1) {
        get_pixels_in_1D_short_array_by_block_2x2
                  ((uint16_t *)
                   (*(long *)(local_10 + 0x28) * 2 +
                    (long)(local_54 * *(int *)(local_10 + 0x20)) * 2 + (long)local_58 * 2),
                   *(int *)(local_10 + 0x20),local_4c);
        iVar1 = is_block16_2x2_row_same_value(local_4c);
        *(char *)(*local_20 + (long)local_50) = (char)iVar1;
        iVar1 = is_block16_2x2_col_same_value(local_4c);
        *(char *)(local_20[1] + (long)local_50) = (char)iVar1;
        uVar2 = av1_get_crc_value((CRC_CALCULATOR *)
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                  (uint8_t *)
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
        *(uint32_t *)(*local_18 + (long)local_50 * 4) = uVar2;
        uVar2 = av1_get_crc_value((CRC_CALCULATOR *)
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                  (uint8_t *)
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
        *(uint32_t *)(local_18[1] + (long)local_50 * 4) = uVar2;
        local_50 = local_50 + 1;
      }
      local_50 = local_50 + 1;
    }
  }
  return;
}

Assistant:

void av1_generate_block_2x2_hash_value(IntraBCHashInfo *intrabc_hash_info,
                                       const YV12_BUFFER_CONFIG *picture,
                                       uint32_t *pic_block_hash[2],
                                       int8_t *pic_block_same_info[3]) {
  const int width = 2;
  const int height = 2;
  const int x_end = picture->y_crop_width - width + 1;
  const int y_end = picture->y_crop_height - height + 1;
  CRC_CALCULATOR *calc_1 = &intrabc_hash_info->crc_calculator1;
  CRC_CALCULATOR *calc_2 = &intrabc_hash_info->crc_calculator2;

  const int length = width * 2;
  if (picture->flags & YV12_FLAG_HIGHBITDEPTH) {
    uint16_t p[4];
    int pos = 0;
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      for (int x_pos = 0; x_pos < x_end; x_pos++) {
        get_pixels_in_1D_short_array_by_block_2x2(
            CONVERT_TO_SHORTPTR(picture->y_buffer) + y_pos * picture->y_stride +
                x_pos,
            picture->y_stride, p);
        pic_block_same_info[0][pos] = is_block16_2x2_row_same_value(p);
        pic_block_same_info[1][pos] = is_block16_2x2_col_same_value(p);

        pic_block_hash[0][pos] =
            av1_get_crc_value(calc_1, (uint8_t *)p, length * sizeof(p[0]));
        pic_block_hash[1][pos] =
            av1_get_crc_value(calc_2, (uint8_t *)p, length * sizeof(p[0]));
        pos++;
      }
      pos += width - 1;
    }
  } else {
    uint8_t p[4];
    int pos = 0;
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      for (int x_pos = 0; x_pos < x_end; x_pos++) {
        get_pixels_in_1D_char_array_by_block_2x2(
            picture->y_buffer + y_pos * picture->y_stride + x_pos,
            picture->y_stride, p);
        pic_block_same_info[0][pos] = is_block_2x2_row_same_value(p);
        pic_block_same_info[1][pos] = is_block_2x2_col_same_value(p);

        pic_block_hash[0][pos] =
            av1_get_crc_value(calc_1, p, length * sizeof(p[0]));
        pic_block_hash[1][pos] =
            av1_get_crc_value(calc_2, p, length * sizeof(p[0]));
        pos++;
      }
      pos += width - 1;
    }
  }
}